

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

tuple<long,_long> calcSum<stSampleMulti<short,4>>(TWaveformViewT<TSampleMI16> *waveform)

{
  short sVar1;
  long lVar2;
  _Head_base<0UL,_long,_false> _Var3;
  long *in_RSI;
  long lVar4;
  long lVar5;
  stSampleMulti<short,_4> *psVar6;
  int j;
  long lVar7;
  tuple<long,_long> tVar8;
  
  lVar2 = *in_RSI;
  lVar4 = 0;
  _Var3._M_head_impl = in_RSI[1];
  if (in_RSI[1] < 1) {
    _Var3._M_head_impl = lVar4;
  }
  lVar5 = 0;
  psVar6 = (stSampleMulti<short,_4> *)0x0;
  for (; lVar4 != _Var3._M_head_impl; lVar4 = lVar4 + 1) {
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      sVar1 = *(short *)(lVar2 + lVar7 * 2);
      lVar5 = lVar5 + sVar1;
      psVar6 = (stSampleMulti<short,_4> *)
               ((long)(psVar6->super_array<short,_4UL>)._M_elems +
               (ulong)(uint)((int)sVar1 * (int)sVar1));
    }
    lVar2 = lVar2 + 8;
  }
  waveform->samples = psVar6;
  waveform->n = lVar5;
  tVar8.super__Tuple_impl<0UL,_long,_long>.super__Head_base<0UL,_long,_false>._M_head_impl =
       _Var3._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_long,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       (_Head_base<1UL,_long,_false>)(_Head_base<1UL,_long,_false>)waveform;
  return (tuple<long,_long>)tVar8.super__Tuple_impl<0UL,_long,_long>;
}

Assistant:

std::tuple<int64_t, int64_t> calcSum(const TWaveformViewT<TSampleMI16> & waveform) {
    int64_t sum = 0;
    int64_t sum2 = 0;

    auto samples = waveform.samples;
    auto n       = waveform.n;

    for (int is = 0; is < n; ++is) {
        for (int j = 0; j < TSampleMI16::N; j++) {
            int32_t a0 = samples[is][j];
            sum += a0;
            sum2 += a0*a0;
        }
    }

    return std::tuple<int64_t, int64_t>(sum, sum2);
}